

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

PatternList *
parse_long(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer *pppOVar1;
  pointer pOVar2;
  undefined1 *puVar3;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *pvVar4;
  bool bVar5;
  __type_conflict _Var6;
  long lVar7;
  OptionError *pOVar8;
  string *psVar9;
  Option *option;
  pointer pOVar10;
  string local_1c8;
  undefined1 local_1a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixes;
  string equal;
  undefined1 local_150 [8];
  value val;
  string longOpt;
  int argcount;
  undefined1 auStack_d8 [8];
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  shared_ptr<docopt::Option> o;
  allocator local_31;
  
  val.variant._24_8_ = &longOpt._M_string_length;
  longOpt._M_dataplus._M_p = (pointer)0x0;
  longOpt._M_string_length._0_1_ = 0;
  prefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&equal._M_string_length;
  equal._M_dataplus._M_p = (pointer)0x0;
  equal._M_string_length._0_1_ = 0;
  local_150._0_4_ = Empty;
  Tokens::pop_abi_cxx11_((string *)((long)&equal.field_2 + 8),tokens);
  std::__cxx11::string::string
            ((string *)(longOpt.field_2._M_local_buf + 8),"=",(allocator *)auStack_d8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<void,_true>((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&similar.
                          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar7 = std::__cxx11::string::find
                    ((string *)(equal.field_2._M_local_buf + 8),(ulong)((long)&longOpt.field_2 + 8))
  ;
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)&__range2,(ulong)((long)&equal.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)
               &similar.
                super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&ret.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl.field_2 + 8));
    std::__cxx11::string::resize((ulong)((long)&equal.field_2 + 8));
  }
  std::__cxx11::string::operator=
            ((string *)
             (ret.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2._M_local_buf + 8),(string *)(equal.field_2._M_local_buf + 8));
  __range2 = (vector<docopt::Option,_std::allocator<docopt::Option>_> *)local_150;
  o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       &prefixes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&val.variant + 0x18);
  std::_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,docopt::value&>::
  _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,docopt::value&> *)
             &__range2,
             (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&similar.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&similar.
                     super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(longOpt.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(equal.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &similar.
              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"--",(allocator *)&__range2);
  bVar5 = anon_unknown.dwarf_4e28d::starts_with
                    ((string *)((long)&val.variant + 0x18),
                     (string *)
                     &similar.
                      super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar5) {
    __assert_fail("starts_with(longOpt, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0xd9,"PatternList parse_long(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string
            ((string *)
             &similar.
              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (equal._M_dataplus._M_p == (pointer)0x0) {
    pppOVar1 = &similar.
                super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)similar.
                          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    docopt::value::operator=((value *)local_150,(value *)pppOVar1);
    docopt::value::~value((value *)pppOVar1);
  }
  auStack_d8 = (undefined1  [8])0x0;
  similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar2 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ret.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._8_8_ = options;
  for (pOVar10 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
                 _M_impl.super__Vector_impl_data._M_start; pOVar10 != pOVar2; pOVar10 = pOVar10 + 1)
  {
    _Var6 = std::operator==(&pOVar10->fLongOption,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&val.variant + 0x18));
    if (_Var6) {
      similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pOVar10;
      std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>::
      emplace_back<docopt::Option_const*>
                ((vector<docopt::Option_const*,std::allocator<docopt::Option_const*>> *)auStack_d8,
                 (Option **)
                 &similar.
                  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  if ((tokens->fIsParsingArgv == true) &&
     (auStack_d8 ==
      (undefined1  [8])
      similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    puVar3 = *(undefined1 **)
              (ret.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2._8_8_ + 8);
    for (psVar9 = (string *)
                  (*(long *)ret.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl.field_2._8_8_ + 0x70);
        &psVar9[-4].field_2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3; psVar9 = (string *)(psVar9[4].field_2._M_local_buf + 8)) {
      if ((psVar9->_M_string_length != 0) &&
         (bVar5 = anon_unknown.dwarf_4e28d::starts_with
                            (psVar9,(string *)((long)&val.variant + 0x18)), bVar5)) {
        similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&psVar9[-4].field_2;
        std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>::
        emplace_back<docopt::Option_const*>
                  ((vector<docopt::Option_const*,std::allocator<docopt::Option_const*>> *)auStack_d8
                   ,(Option **)
                    &similar.
                     super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ulong)((long)similar.
                    super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8) < 9) {
    if (auStack_d8 ==
        (undefined1  [8])
        similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      longOpt.field_2._8_4_ = ZEXT14(equal._M_dataplus._M_p != (pointer)0x0);
      std::vector<docopt::Option,std::allocator<docopt::Option>>::
      emplace_back<char_const(&)[1],std::__cxx11::string&,int&>
                ((vector<docopt::Option,std::allocator<docopt::Option>> *)
                 ret.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2._8_8_,(char (*) [1])0x156cd1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&val.variant + 0x18),(int *)(longOpt.field_2._M_local_buf + 8));
      std::make_shared<docopt::Option,docopt::Option&>((Option *)&__range2);
      pvVar4 = __range2;
      if (tokens->fIsParsingArgv == true) {
        if (longOpt.field_2._8_4_ == 0) {
          similar.
          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(similar.
                                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
          ret.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ._M_head_impl._M_dataplus._M_p._0_1_ = 1;
        }
        else {
          docopt::value::value
                    ((value *)&similar.
                               super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(value *)local_150
                    );
        }
        pppOVar1 = &similar.
                    super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        docopt::value::operator=
                  ((value *)&pvVar4[1].
                             super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(value *)pppOVar1);
        docopt::value::~value((value *)pppOVar1);
      }
      pppOVar1 = &similar.
                  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<docopt::Option,void>
                ((__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2> *)pppOVar1,
                 (__shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2> *)&__range2);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)pppOVar1);
    }
    else {
      std::make_shared<docopt::Option,docopt::Option_const&>((Option *)&__range2);
      if (*(int *)&__range2[6].super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                   _M_impl.super__Vector_impl_data._M_start == 0) {
        if (local_150._0_4_ != Empty) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &similar.
                          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2[4].
                          super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         " must not have an argument");
          pOVar8 = (OptionError *)__cxa_allocate_exception(0x10);
          Tokens::OptionError::runtime_error
                    (pOVar8,(string *)
                            &similar.
                             super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __cxa_throw(pOVar8,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else if (local_150._0_4_ == Empty) {
        psVar9 = Tokens::current_abi_cxx11_(tokens);
        if ((psVar9->_M_string_length == 0) || (bVar5 = std::operator==(psVar9,"--"), bVar5)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &similar.
                          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2[4].
                          super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage," requires an argument")
          ;
          pOVar8 = (OptionError *)__cxa_allocate_exception(0x10);
          Tokens::OptionError::runtime_error
                    (pOVar8,(string *)
                            &similar.
                             super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __cxa_throw(pOVar8,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
        }
        Tokens::pop_abi_cxx11_(&local_1c8,tokens);
        docopt::value::value
                  ((value *)&similar.
                             super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c8);
        pppOVar1 = &similar.
                    super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        docopt::value::operator=((value *)local_150,(value *)pppOVar1);
        docopt::value::~value((value *)pppOVar1);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      pvVar4 = __range2;
      if (tokens->fIsParsingArgv == true) {
        if (local_150._0_4_ == Empty) {
          similar.
          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(similar.
                                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
          ret.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ._M_head_impl._M_dataplus._M_p._0_1_ = 1;
        }
        else {
          docopt::value::value
                    ((value *)&similar.
                               super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(value *)local_150
                    );
        }
        pppOVar1 = &similar.
                    super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        docopt::value::operator=
                  ((value *)&pvVar4[1].
                             super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(value *)pppOVar1);
        docopt::value::~value((value *)pppOVar1);
      }
      pppOVar1 = &similar.
                  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<docopt::Option,void>
                ((__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2> *)pppOVar1,
                 (__shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2> *)&__range2);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)pppOVar1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ret);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&o);
    std::_Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::
    ~_Vector_base((_Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                  auStack_d8);
    docopt::value::~value((value *)local_150);
    std::__cxx11::string::~string
              ((string *)
               &prefixes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)((long)&val.variant + 0x18));
    return __return_storage_ptr__;
  }
  longOptions<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a8,
             (__normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
              )auStack_d8,
             (__normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
              )similar.
               super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
               _M_impl.super__Vector_impl_data._M_start);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,"\'"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&val.variant + 0x18));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &similar.
                  super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 "\' is not a unique prefix: ");
  std::__cxx11::string::~string((string *)&__range2);
  std::__cxx11::string::string((string *)(longOpt.field_2._M_local_buf + 8),", ",&local_31);
  if (local_1a8 ==
      (undefined1  [8])
      prefixes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __range2 = (vector<docopt::Option,_std::allocator<docopt::Option>_> *)
               &o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
         0xffffffffffffff00;
  }
  else {
    std::__cxx11::string::string((string *)&__range2,(string *)local_1a8);
    while (local_1a8 = (undefined1  [8])((long)local_1a8 + 0x20),
          local_1a8 !=
          (undefined1  [8])
          prefixes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((string *)&__range2);
      std::__cxx11::string::append((string *)&__range2);
    }
  }
  std::__cxx11::string::append
            ((string *)
             &similar.
              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&__range2);
  std::__cxx11::string::~string((string *)(longOpt.field_2._M_local_buf + 8));
  pOVar8 = (OptionError *)__cxa_allocate_exception(0x10);
  Tokens::OptionError::runtime_error
            (pOVar8,(string *)
                    &similar.
                     super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __cxa_throw(pOVar8,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static PatternList parse_long(Tokens& tokens, std::vector<Option>& options)
{
	// long ::= '--' chars [ ( ' ' | '=' ) chars ] ;
	std::string longOpt, equal;
	value val;
	std::tie(longOpt, equal, val) = partition(tokens.pop(), "=");

	assert(starts_with(longOpt, "--"));

	if (equal.empty()) {
		val = value{};
	}

	// detect with options match this long option
	std::vector<Option const*> similar;
	for(auto const& option : options) {
		if (option.longOption()==longOpt)
			similar.push_back(&option);
	}

	// maybe allow similar options that match by prefix
	if (tokens.isParsingArgv() && similar.empty()) {
		for(auto const& option : options) {
			if (option.longOption().empty())
				continue;
			if (starts_with(option.longOption(), longOpt))
				similar.push_back(&option);
		}
	}

	PatternList ret;

	if (similar.size() > 1) { // might be simply specified ambiguously 2+ times?
		std::vector<std::string> prefixes = longOptions(similar.begin(), similar.end());
		std::string error = "'" + longOpt + "' is not a unique prefix: ";
		error.append(join(prefixes.begin(), prefixes.end(), ", "));
		throw Tokens::OptionError(std::move(error));
	} else if (similar.empty()) {
		int argcount = equal.empty() ? 0 : 1;
		options.emplace_back("", longOpt, argcount);

		auto o = std::make_shared<Option>(options.back());
		if (tokens.isParsingArgv()) {
			o->setValue(argcount ? value{val} : value{true});
		}
		ret.push_back(o);
	} else {
		auto o = std::make_shared<Option>(*similar[0]);
		if (o->argCount() == 0) {
			if (val) {
				std::string error = o->longOption() + " must not have an argument";
				throw Tokens::OptionError(std::move(error));
			}
		} else {
			if (!val) {
				auto const& token = tokens.current();
				if (token.empty() || token=="--") {
					std::string error = o->longOption() + " requires an argument";
					throw Tokens::OptionError(std::move(error));
				}
				val = tokens.pop();
			}
		}
		if (tokens.isParsingArgv()) {
			o->setValue(val ? std::move(val) : value{true});
		}
		ret.push_back(o);
	}

	return ret;
}